

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  size_t n;
  iterator begin;
  iterator end;
  type pwVar1;
  undefined4 in_register_00000034;
  type local_30;
  type *local_28;
  type *it;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *this_local;
  string_view value_local;
  
  this_local = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                *)CONCAT44(in_register_00000034,__fd);
  it = (type *)this;
  value_local.data_ = (char *)__buf;
  n = basic_string_view<char>::size((basic_string_view<char> *)&this_local);
  local_30 = reserve(this,n);
  local_28 = &local_30;
  begin = basic_string_view<char>::begin((basic_string_view<char> *)&this_local);
  end = basic_string_view<char>::end((basic_string_view<char> *)&this_local);
  pwVar1 = internal::copy_str<wchar_t,char_const*,wchar_t*>(begin,end,*local_28);
  *local_28 = pwVar1;
  return (ssize_t)local_28;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }